

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3tmat_io.c
# Opt level: O3

int s3tmat_write(char *fn,float32 ***tmat,uint32 n_tmat,uint32 n_state)

{
  FILE *fp;
  uint d2;
  int iVar1;
  int32 iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32 d3;
  ulong uVar6;
  uint32 chksum;
  uint32 ignore;
  undefined8 in_stack_ffffffffffffff78;
  uint32 *chksum_00;
  undefined4 uVar7;
  uint32 local_64;
  ulong local_60;
  uint32 local_54;
  char *local_50;
  FILE *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar6 = (ulong)n_state;
  local_64 = 0;
  local_54 = 0;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  local_48 = s3open(fn,"wb",(uint32 *)0x0);
  iVar1 = -1;
  if (local_48 != (FILE *)0x0) {
    d2 = n_state - 1;
    local_60 = uVar6;
    local_50 = fn;
    if (n_tmat != 0) {
      local_40 = (ulong)n_tmat;
      local_38 = (ulong)d2;
      uVar4 = 0;
      do {
        if (d2 != 0) {
          uVar5 = 0;
          do {
            if ((int)local_60 != 0) {
              uVar3 = 0;
              do {
                if ((float)tmat[uVar4][uVar5][uVar3] < 0.0) {
                  in_stack_ffffffffffffff78 =
                       CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)uVar3);
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                          ,0x93,"tmat[%u][%u][%u] < 0 (%e)\n",
                          (double)(float)tmat[uVar4][uVar5][uVar3],uVar4 & 0xffffffff,
                          uVar5 & 0xffffffff,in_stack_ffffffffffffff78);
                }
                uVar3 = uVar3 + 1;
              } while (uVar6 != uVar3);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != local_38);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != local_40);
    }
    d3 = (uint32)local_60;
    floor_nz_3d(tmat,n_tmat,d2,d3,1.2e-38);
    fp = local_48;
    chksum_00 = &local_64;
    iVar1 = bio_fwrite_3d(tmat,4,n_tmat,d2,d3,local_48,chksum_00);
    uVar7 = (undefined4)((ulong)chksum_00 >> 0x20);
    if (iVar1 < 0) {
      s3close(fp);
      iVar1 = -1;
    }
    else {
      iVar2 = bio_fwrite(&local_64,4,1,fp,0,&local_54);
      s3close(fp);
      iVar1 = -1;
      if (iVar2 == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3tmat_io.c"
                ,0xb0,"Wrote %s [%ux%ux%u array]\n",local_50,(ulong)n_tmat,CONCAT44(uVar7,d2),d3);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
s3tmat_write(const char *fn,
	     float32 ***tmat,
	     uint32 n_tmat,
	     uint32 n_state)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;
    int t, i, j;
    
    s3clr_fattr();
    s3add_fattr("version", TMAT_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    for (t = 0; t < n_tmat; t++) {
	for (i = 0; i < n_state-1; i++) {
	    for (j = 0; j < n_state; j++) {
		if (tmat[t][i][j] < 0) {
		    E_ERROR("tmat[%u][%u][%u] < 0 (%e)\n",
			    t, i, j, tmat[t][i][j]);
		}
	    }
	}
    }

    /* floor all non-zero entries to this value to make sure
       that results are compatible between machines */
    floor_nz_3d(tmat, n_tmat, n_state-1, n_state, MIN_POS_FLOAT32);

    if (bio_fwrite_3d((void ***)tmat,
		   sizeof(float32),
		   n_tmat,
		   n_state-1,
		   n_state,
		   fp,
		   &chksum) < 0) {
	s3close(fp);

	return S3_ERROR;
    }
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);
	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_tmat, n_state-1, n_state);

    return S3_SUCCESS;
}